

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void __thiscall xlib::Log::Format<char*>(Log *this,string *format,char **first)

{
  char *__s;
  ulong uVar1;
  size_t sVar2;
  ostringstream oss;
  undefined1 auStack_1b8 [8];
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  long local_190 [14];
  ios_base local_120 [264];
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x12548e,0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    __s = *first;
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x28);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(char *)0x2,(ulong)local_1b0);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }